

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O0

void Ivy_FraigAssignDist1(Ivy_FraigMan_t *p,uint *pPat)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_FraigSim_t *pIVar3;
  int local_44;
  int local_24;
  int Limit;
  int i;
  Ivy_Obj_t *pObj;
  uint *pPat_local;
  Ivy_FraigMan_t *p_local;
  
  for (local_24 = 0; iVar1 = Vec_PtrSize(p->pManAig->vPis), local_24 < iVar1;
      local_24 = local_24 + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(p->pManAig->vPis,local_24);
    iVar1 = Ivy_InfoHasBit(pPat,local_24);
    Ivy_NodeAssignConst(p,pIVar2,iVar1);
  }
  iVar1 = Ivy_ManPiNum(p->pManAig);
  if (iVar1 < p->nSimWords * 0x20 + -1) {
    local_44 = Ivy_ManPiNum(p->pManAig);
  }
  else {
    local_44 = p->nSimWords * 0x20 + -1;
  }
  for (local_24 = 0; local_24 < local_44; local_24 = local_24 + 1) {
    pIVar2 = Ivy_ManPi(p->pManAig,local_24);
    pIVar3 = Ivy_ObjSim(pIVar2);
    Ivy_InfoXorBit((uint *)(pIVar3 + 1),local_24 + 1);
  }
  return;
}

Assistant:

void Ivy_FraigAssignDist1( Ivy_FraigMan_t * p, unsigned * pPat )
{
    Ivy_Obj_t * pObj;
    int i, Limit;
    Ivy_ManForEachPi( p->pManAig, pObj, i )
    {
        Ivy_NodeAssignConst( p, pObj, Ivy_InfoHasBit(pPat, i) );
//        printf( "%d", Ivy_InfoHasBit(pPat, i) );
    }
//    printf( "\n" );

    Limit = IVY_MIN( Ivy_ManPiNum(p->pManAig), p->nSimWords * 32 - 1 );
    for ( i = 0; i < Limit; i++ )
        Ivy_InfoXorBit( Ivy_ObjSim( Ivy_ManPi(p->pManAig,i) )->pData, i+1 );
}